

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls1_check_duplicate_extensions(CBS *cbs)

{
  unsigned_short uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  unsigned_short *puVar6;
  unsigned_short *__last;
  size_t local_88;
  size_t i_1;
  CBS extension_1;
  size_t i;
  undefined1 local_58 [8];
  Array<unsigned_short> extension_types;
  CBS extension;
  undefined1 auStack_30 [6];
  uint16_t type;
  CBS extensions;
  size_t num_extensions;
  CBS *cbs_local;
  
  extensions.len = 0;
  _auStack_30 = cbs->data;
  extensions.data = (uint8_t *)cbs->len;
  while (sVar4 = CBS_len((CBS *)auStack_30), sVar4 != 0) {
    iVar3 = CBS_get_u16((CBS *)auStack_30,(uint16_t *)((long)&extension.len + 6));
    if ((iVar3 == 0) ||
       (iVar3 = CBS_get_u16_length_prefixed((CBS *)auStack_30,(CBS *)&extension_types.size_),
       iVar3 == 0)) {
      return false;
    }
    extensions.len = extensions.len + 1;
  }
  if (extensions.len == 0) {
    cbs_local._7_1_ = true;
  }
  else {
    Array<unsigned_short>::Array((Array<unsigned_short> *)local_58);
    bVar2 = Array<unsigned_short>::InitForOverwrite
                      ((Array<unsigned_short> *)local_58,extensions.len);
    if (bVar2) {
      _auStack_30 = cbs->data;
      extensions.data = (uint8_t *)cbs->len;
      for (extension_1.len = 0; sVar4 = extension_1.len,
          sVar5 = Array<unsigned_short>::size((Array<unsigned_short> *)local_58), sVar4 < sVar5;
          extension_1.len = extension_1.len + 1) {
        puVar6 = Array<unsigned_short>::operator[]
                           ((Array<unsigned_short> *)local_58,extension_1.len);
        iVar3 = CBS_get_u16((CBS *)auStack_30,puVar6);
        if ((iVar3 == 0) ||
           (iVar3 = CBS_get_u16_length_prefixed((CBS *)auStack_30,(CBS *)&i_1), iVar3 == 0)) {
          cbs_local._7_1_ = false;
          goto LAB_00164daf;
        }
      }
      sVar4 = CBS_len((CBS *)auStack_30);
      if (sVar4 != 0) {
        __assert_fail("CBS_len(&extensions) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x58,"bool bssl::tls1_check_duplicate_extensions(const CBS *)");
      }
      puVar6 = Array<unsigned_short>::begin((Array<unsigned_short> *)local_58);
      __last = Array<unsigned_short>::end((Array<unsigned_short> *)local_58);
      std::sort<unsigned_short*>(puVar6,__last);
      for (local_88 = 1; local_88 < extensions.len; local_88 = local_88 + 1) {
        puVar6 = Array<unsigned_short>::operator[]((Array<unsigned_short> *)local_58,local_88 - 1);
        uVar1 = *puVar6;
        puVar6 = Array<unsigned_short>::operator[]((Array<unsigned_short> *)local_58,local_88);
        if (uVar1 == *puVar6) {
          cbs_local._7_1_ = false;
          goto LAB_00164daf;
        }
      }
      cbs_local._7_1_ = true;
    }
    else {
      cbs_local._7_1_ = false;
    }
LAB_00164daf:
    Array<unsigned_short>::~Array((Array<unsigned_short> *)local_58);
  }
  return cbs_local._7_1_;
}

Assistant:

static bool tls1_check_duplicate_extensions(const CBS *cbs) {
  // First pass: count the extensions.
  size_t num_extensions = 0;
  CBS extensions = *cbs;
  while (CBS_len(&extensions) > 0) {
    uint16_t type;
    CBS extension;

    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      return false;
    }

    num_extensions++;
  }

  if (num_extensions == 0) {
    return true;
  }

  Array<uint16_t> extension_types;
  if (!extension_types.InitForOverwrite(num_extensions)) {
    return false;
  }

  // Second pass: gather the extension types.
  extensions = *cbs;
  for (size_t i = 0; i < extension_types.size(); i++) {
    CBS extension;

    if (!CBS_get_u16(&extensions, &extension_types[i]) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      // This should not happen.
      return false;
    }
  }
  assert(CBS_len(&extensions) == 0);

  // Sort the extensions and make sure there are no duplicates.
  std::sort(extension_types.begin(), extension_types.end());
  for (size_t i = 1; i < num_extensions; i++) {
    if (extension_types[i - 1] == extension_types[i]) {
      return false;
    }
  }

  return true;
}